

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_sequence_append(fy_node *fyn_seq,fy_node *fyn)

{
  int ret;
  fy_node *fyn_local;
  fy_node *fyn_seq_local;
  
  fyn_seq_local._4_4_ = fy_node_sequence_insert_prepare(fyn_seq,fyn);
  if (fyn_seq_local._4_4_ == 0) {
    fy_node_mark_synthetic(fyn_seq);
    fy_node_list_add_tail(&(fyn_seq->field_12).sequence,fyn);
    fyn->field_0x34 = fyn->field_0x34 & 0xf7 | 8;
    fyn_seq_local._4_4_ = 0;
  }
  return fyn_seq_local._4_4_;
}

Assistant:

int fy_node_sequence_append(struct fy_node *fyn_seq, struct fy_node *fyn) {
    int ret;

    ret = fy_node_sequence_insert_prepare(fyn_seq, fyn);
    if (ret)
        return ret;

    fy_node_mark_synthetic(fyn_seq);
    fy_node_list_add_tail(&fyn_seq->sequence, fyn);
    fyn->attached = true;
    return 0;
}